

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMem.c
# Opt level: O1

void Aig_MmFlexStop(Aig_MmFlex_t *p,int fVerbose)

{
  long lVar1;
  
  if (p != (Aig_MmFlex_t *)0x0) {
    if (fVerbose != 0) {
      printf("Flexible memory manager: Chunk size = %d. Chunks used = %d.\n",
             (ulong)(uint)p->nChunkSize,(ulong)(uint)p->nChunks);
      printf("   Entries used = %d. Memory used = %d. Memory alloc = %d.\n",
             (ulong)(uint)p->nEntriesUsed,(ulong)(uint)p->nMemoryUsed,(ulong)(uint)p->nMemoryAlloc);
    }
    if (0 < p->nChunks) {
      lVar1 = 0;
      do {
        if (p->pChunks[lVar1] != (char *)0x0) {
          free(p->pChunks[lVar1]);
          p->pChunks[lVar1] = (char *)0x0;
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < p->nChunks);
    }
    if (p->pChunks != (char **)0x0) {
      free(p->pChunks);
      p->pChunks = (char **)0x0;
    }
    free(p);
    return;
  }
  return;
}

Assistant:

void Aig_MmFlexStop( Aig_MmFlex_t * p, int fVerbose )
{
    int i;
    if ( p == NULL )
        return;
    if ( fVerbose )
    {
        printf( "Flexible memory manager: Chunk size = %d. Chunks used = %d.\n",
            p->nChunkSize, p->nChunks );
        printf( "   Entries used = %d. Memory used = %d. Memory alloc = %d.\n",
            p->nEntriesUsed, p->nMemoryUsed, p->nMemoryAlloc );
    }
    for ( i = 0; i < p->nChunks; i++ )
        ABC_FREE( p->pChunks[i] );
    ABC_FREE( p->pChunks );
    ABC_FREE( p );
}